

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  size_type sVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob1_7;
  size_t b_3;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_6;
  int i_5;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  float coeff;
  Mat *bottom_blob1_5;
  size_t b_2;
  int i_4;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  float coeff1;
  float coeff0;
  Mat *bottom_blob1_4;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob1_3;
  size_t b_1;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_2;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob1_1;
  size_t b;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffff7b0;
  Mat *in_stack_fffffffffffff7b8;
  Mat *pMVar4;
  undefined8 in_stack_fffffffffffff7c0;
  int iVar5;
  undefined8 in_stack_fffffffffffff7c8;
  ulong uVar6;
  Mat *in_stack_fffffffffffff7d0;
  int local_6ec;
  Mat local_6e8;
  Mat *local_6a8;
  Mat local_6a0;
  float *local_660;
  int local_654;
  const_reference local_650;
  ulong local_648;
  int local_63c;
  Mat local_638;
  float *local_5f8;
  Mat local_5f0;
  float *local_5b0;
  Mat local_5a8;
  float *local_568;
  int local_55c;
  const_reference local_558;
  int local_54c;
  Mat local_548;
  float *local_508;
  Mat local_500;
  float *local_4c0;
  int local_4b8;
  float local_4b4;
  const_reference local_4b0;
  ulong local_4a8;
  int local_49c;
  Mat local_498;
  float *local_458;
  Mat local_450;
  float *local_410;
  Mat local_408;
  float *local_3c8;
  int local_3bc;
  float local_3b8;
  float local_3b4;
  const_reference local_3b0;
  int local_3a4;
  Mat local_3a0;
  float *local_360;
  Mat local_358;
  float *local_318;
  int local_30c;
  const_reference local_308;
  ulong local_300;
  int local_2f4;
  Mat local_2f0;
  float *local_2b0;
  Mat local_2a8;
  float *local_268;
  Mat local_260;
  float *local_220;
  int local_214;
  const_reference local_210;
  int local_204;
  Mat local_200;
  float *local_1c0;
  Mat local_1b8;
  float *local_178;
  int local_16c;
  const_reference local_168;
  ulong local_160;
  int local_154;
  Mat local_150;
  float *local_110;
  Mat local_108;
  float *local_c8;
  Mat local_b0;
  float *local_70;
  int local_64;
  const_reference local_60;
  reference local_58;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->w;
  local_38 = local_30->h;
  local_3c = local_30->c;
  local_48 = local_30->elemsize;
  local_4c = local_34 * local_38;
  local_58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  Mat::create(in_stack_fffffffffffff7d0,(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
              (int)in_stack_fffffffffffff7c8,iVar5,(size_t)in_stack_fffffffffffff7b8,
              (Allocator *)in_stack_fffffffffffff7b0);
  bVar1 = Mat::empty(in_stack_fffffffffffff7b0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0x80) == 0) {
      local_60 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
      for (local_64 = 0; local_64 < local_3c; local_64 = local_64 + 1) {
        Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_b0);
        Mat::~Mat((Mat *)0x152bf8);
        local_70 = pfVar2;
        Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_108);
        Mat::~Mat((Mat *)0x152c50);
        local_c8 = pfVar2;
        Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_150);
        Mat::~Mat((Mat *)0x152ca8);
        for (local_154 = 0; local_154 < local_4c; local_154 = local_154 + 1) {
          pfVar2[local_154] = local_70[local_154] * local_c8[local_154];
        }
        local_110 = pfVar2;
      }
      for (local_160 = 2; uVar6 = local_160,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18), uVar6 < sVar3;
          local_160 = local_160 + 1) {
        local_168 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_160);
        for (local_16c = 0; local_16c < local_3c; local_16c = local_16c + 1) {
          Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_1b8);
          Mat::~Mat((Mat *)0x152e74);
          local_178 = pfVar2;
          Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_200);
          Mat::~Mat((Mat *)0x152ecc);
          for (local_204 = 0; local_204 < local_4c; local_204 = local_204 + 1) {
            pfVar2[local_204] = local_178[local_204] * pfVar2[local_204];
          }
          local_1c0 = pfVar2;
        }
      }
    }
    else if (*(int *)(in_RDI + 0x80) == 1) {
      if (*(int *)(in_RDI + 0xb4) == 0) {
        local_210 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
        for (local_214 = 0; local_214 < local_3c; local_214 = local_214 + 1) {
          Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_260);
          Mat::~Mat((Mat *)0x15306c);
          local_220 = pfVar2;
          Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_2a8);
          Mat::~Mat((Mat *)0x1530c4);
          local_268 = pfVar2;
          Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_2f0);
          Mat::~Mat((Mat *)0x15311c);
          for (local_2f4 = 0; local_2f4 < local_4c; local_2f4 = local_2f4 + 1) {
            pfVar2[local_2f4] = local_220[local_2f4] + local_268[local_2f4];
          }
          local_2b0 = pfVar2;
        }
        for (local_300 = 2; uVar6 = local_300,
            sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18),
            uVar6 < sVar3; local_300 = local_300 + 1) {
          local_308 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_300);
          for (local_30c = 0; local_30c < local_3c; local_30c = local_30c + 1) {
            Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_358);
            Mat::~Mat((Mat *)0x1532e8);
            local_318 = pfVar2;
            Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_3a0);
            Mat::~Mat((Mat *)0x153340);
            for (local_3a4 = 0; local_3a4 < local_4c; local_3a4 = local_3a4 + 1) {
              pfVar2[local_3a4] = local_318[local_3a4] + pfVar2[local_3a4];
            }
            local_360 = pfVar2;
          }
        }
      }
      else {
        local_3b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
        pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x88),0);
        local_3b4 = *pfVar2;
        pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x88),1);
        local_3b8 = *pfVar2;
        for (local_3bc = 0; local_3bc < local_3c; local_3bc = local_3bc + 1) {
          Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_408);
          Mat::~Mat((Mat *)0x1534ff);
          local_3c8 = pfVar2;
          Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_450);
          Mat::~Mat((Mat *)0x153557);
          local_410 = pfVar2;
          Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_498);
          Mat::~Mat((Mat *)0x1535af);
          for (local_49c = 0; local_49c < local_4c; local_49c = local_49c + 1) {
            pfVar2[local_49c] = local_3c8[local_49c] * local_3b4 + local_410[local_49c] * local_3b8;
          }
          local_458 = pfVar2;
        }
        for (local_4a8 = 2; uVar6 = local_4a8,
            sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18),
            uVar6 < sVar3; local_4a8 = local_4a8 + 1) {
          local_4b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_4a8);
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x88),(int)local_4a8);
          local_4b4 = *pfVar2;
          for (local_4b8 = 0; local_4b8 < local_3c; local_4b8 = local_4b8 + 1) {
            Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_500);
            Mat::~Mat((Mat *)0x1537ad);
            local_4c0 = pfVar2;
            Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_548);
            Mat::~Mat((Mat *)0x1537f9);
            for (local_54c = 0; local_54c < local_4c; local_54c = local_54c + 1) {
              pfVar2[local_54c] = local_4c0[local_54c] * local_4b4 + pfVar2[local_54c];
            }
            local_508 = pfVar2;
          }
        }
      }
    }
    else if (*(int *)(in_RDI + 0x80) == 2) {
      local_558 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
      for (local_55c = 0; local_55c < local_3c; local_55c = local_55c + 1) {
        Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_5a8);
        Mat::~Mat((Mat *)0x153983);
        local_568 = pfVar2;
        Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_5f0);
        Mat::~Mat((Mat *)0x1539cf);
        pMVar4 = &local_638;
        local_5b0 = pfVar2;
        Mat::channel(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(pMVar4);
        Mat::~Mat((Mat *)0x153a1b);
        local_5f8 = pfVar2;
        for (local_63c = 0; local_63c < local_4c; local_63c = local_63c + 1) {
          pfVar2 = std::max<float>(local_568 + local_63c,local_5b0 + local_63c);
          local_5f8[local_63c] = *pfVar2;
        }
      }
      local_648 = 2;
      while (uVar6 = local_648,
            sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18),
            uVar6 < sVar3) {
        local_650 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_648);
        for (local_654 = 0; iVar5 = (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
            local_654 < local_3c; local_654 = local_654 + 1) {
          pMVar4 = &local_6a0;
          Mat::channel(pMVar4,iVar5);
          pfVar2 = Mat::operator_cast_to_float_(pMVar4);
          Mat::~Mat((Mat *)0x153be2);
          local_660 = pfVar2;
          Mat::channel(pMVar4,iVar5);
          in_stack_fffffffffffff7b0 = (Mat *)Mat::operator_cast_to_float_(&local_6e8);
          Mat::~Mat((Mat *)0x153c2c);
          local_6a8 = in_stack_fffffffffffff7b0;
          for (local_6ec = 0; local_6ec < local_4c; local_6ec = local_6ec + 1) {
            pfVar2 = std::max<float>((float *)((long)&local_6a8->data + (long)local_6ec * 4),
                                     local_660 + local_6ec);
            *(float *)((long)&local_6a8->data + (long)local_6ec * 4) = *pfVar2;
          }
        }
        local_648 = local_648 + 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b=2; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b=2; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b=2; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b=2; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}